

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void P2Pt::invm3x3<double>(double (*input_m) [3] [3],double (*output_m) [3] [3])

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *in_RSI;
  double *in_RDI;
  double dVar13;
  double c;
  double b;
  double a;
  double invdet_M;
  double I;
  double H;
  double G;
  double F;
  double E;
  double D;
  double C;
  double B;
  double A;
  double i;
  double h;
  double g;
  double f;
  double e;
  double d;
  
  dVar1 = *in_RDI;
  dVar2 = in_RDI[1];
  dVar3 = in_RDI[2];
  dVar4 = in_RDI[3];
  dVar5 = in_RDI[4];
  dVar6 = in_RDI[5];
  dVar7 = in_RDI[6];
  dVar8 = in_RDI[7];
  dVar9 = in_RDI[8];
  dVar10 = dVar5 * dVar9 - dVar6 * dVar8;
  dVar12 = -(dVar4 * dVar9 - dVar6 * dVar7);
  dVar11 = dVar4 * dVar8 - dVar5 * dVar7;
  dVar13 = 1.0 / (dVar1 * dVar10 + dVar2 * dVar12 + dVar3 * dVar11);
  *in_RSI = dVar13 * dVar10;
  in_RSI[1] = dVar13 * -(dVar2 * dVar9 - dVar3 * dVar8);
  in_RSI[2] = dVar13 * (dVar2 * dVar6 - dVar3 * dVar5);
  in_RSI[3] = dVar13 * dVar12;
  in_RSI[4] = dVar13 * (dVar1 * dVar9 - dVar3 * dVar7);
  in_RSI[5] = dVar13 * -(dVar1 * dVar6 - dVar3 * dVar4);
  in_RSI[6] = dVar13 * dVar11;
  in_RSI[7] = dVar13 * -(dVar1 * dVar8 - dVar2 * dVar7);
  in_RSI[8] = dVar13 * (dVar1 * dVar5 - dVar2 * dVar4);
  return;
}

Assistant:

inline void
invm3x3(const T (&input_m)[3][3], T (&output_m)[3][3])
{
	// 3x3 MATRIX INVERSION ALGORITHM
	//             -1               T
	//  -1  [a b c]      1   [A B C]      1   [A D G]
	// M  = [d e f] = ------ [D E F] = ------ [B E H]
	//      [g h i]   det(M) [G H I]   det(M) [C F I]
	//
	// A =  (ei - fh), D = -(bi - ch), G =  (bf - ce),
	// B = -(di - fg), E =  (ai - cg), H = -(af - cd),
	// C =  (dh - eg), F = -(ah - bg), I =  (ae - bd).

	const T 
	a = input_m[0][0], b = input_m[0][1], c = input_m[0][2],
	d = input_m[1][0], e = input_m[1][1], f = input_m[1][2],
	g = input_m[2][0], h = input_m[2][1], i = input_m[2][2];

	const T 
	A =  (e*i - f*h), B = -(d*i - f*g), C =  (d*h - e*g),
	D = -(b*i - c*h), E =  (a*i - c*g), F = -(a*h - b*g),
	G =  (b*f - c*e), H = -(a*f - c*d), I =  (a*e - b*d);

	const T invdet_M = 1. / (a*A + b*B + c*C);
	output_m[0][0] = invdet_M * A; output_m[0][1] = invdet_M * D; output_m[0][2] = invdet_M * G;
	output_m[1][0] = invdet_M * B; output_m[1][1] = invdet_M * E; output_m[1][2] = invdet_M * H;
	output_m[2][0] = invdet_M * C; output_m[2][1] = invdet_M * F; output_m[2][2] = invdet_M * I;
}